

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# import_rule.hpp
# Opt level: O0

error_code __thiscall pstore::exchange::import_ns::rule::pop(rule *this)

{
  context *pcVar1;
  error_code eVar2;
  rule *this_local;
  error_category *local_10;
  
  log_top(this,false);
  pcVar1 = gsl::not_null<pstore::exchange::import_ns::context_*>::operator->(&this->context_);
  std::
  stack<std::unique_ptr<pstore::exchange::import_ns::rule,_std::default_delete<pstore::exchange::import_ns::rule>_>,_std::deque<std::unique_ptr<pstore::exchange::import_ns::rule,_std::default_delete<pstore::exchange::import_ns::rule>_>,_std::allocator<std::unique_ptr<pstore::exchange::import_ns::rule,_std::default_delete<pstore::exchange::import_ns::rule>_>_>_>_>
  ::pop(&pcVar1->stack);
  std::error_code::error_code((error_code *)&this_local);
  eVar2._4_4_ = 0;
  eVar2._M_value = (uint)this_local;
  eVar2._M_cat = local_10;
  return eVar2;
}

Assistant:

std::error_code pop () {
                    this->log_top (false);
                    context_->stack.pop ();
                    return {};
                }